

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,int number,Extension *other_extension)

{
  FieldType type;
  FieldDescriptor *pFVar1;
  _func_int **pp_Var2;
  Rep *pRVar3;
  byte bVar4;
  int iVar5;
  Extension *pEVar6;
  LogMessage *pLVar7;
  LazyMessageExtension *pLVar8;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar9;
  Arena *pAVar10;
  string *psVar11;
  Type *pTVar12;
  undefined4 extraout_var;
  int64 iVar14;
  __pointer_type pSVar15;
  uint64 uVar16;
  uint64 extraout_RDX;
  uint64 extraout_RDX_00;
  uint64 extraout_RDX_01;
  int index;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar17;
  undefined1 auVar18 [16];
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  LogMessage local_80;
  LogFinisher local_41;
  ExtensionSet *local_40;
  byte local_31;
  long *plVar13;
  
  local_40 = this;
  if (other_extension->is_repeated == true) {
    pFVar1 = other_extension->descriptor;
    pVar17 = Insert(this,number);
    pEVar6 = pVar17.first;
    pEVar6->descriptor = pFVar1;
    local_31 = pVar17.second;
    if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (pEVar6->type != other_extension->type) {
        LogMessage::LogMessage
                  (&local_148,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                   ,0x3ab);
        pLVar7 = LogMessage::operator<<
                           (&local_148,"CHECK failed: (extension->type) == (other_extension.type): "
                           );
        LogFinisher::operator=((LogFinisher *)&local_80,pLVar7);
        LogMessage::~LogMessage(&local_148);
      }
      if (pEVar6->is_packed != other_extension->is_packed) {
        LogMessage::LogMessage
                  (&local_110,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                   ,0x3ac);
        pLVar7 = LogMessage::operator<<
                           (&local_110,
                            "CHECK failed: (extension->is_packed) == (other_extension.is_packed): ")
        ;
        LogFinisher::operator=((LogFinisher *)&local_80,pLVar7);
        LogMessage::~LogMessage(&local_110);
      }
      if (pEVar6->is_repeated == false) {
        LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                   ,0x3ad);
        pLVar7 = LogMessage::operator<<(&local_d8,"CHECK failed: extension->is_repeated: ");
        LogFinisher::operator=((LogFinisher *)&local_80,pLVar7);
        LogMessage::~LogMessage(&local_d8);
      }
    }
    else {
      pEVar6->type = other_extension->type;
      pEVar6->is_packed = other_extension->is_packed;
      pEVar6->is_repeated = true;
    }
    bVar4 = other_extension->type;
    if ((byte)(bVar4 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar7 = LogMessage::operator<<
                         (&local_80,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_41,pLVar7);
      LogMessage::~LogMessage(&local_80);
    }
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar4 * 4)) {
    case 1:
    case 8:
      if ((local_31 & 1) != 0) {
        pAVar10 = local_40->arena_;
        if (pAVar10 == (Arena *)0x0) {
          pLVar8 = (LazyMessageExtension *)operator_new(0x10);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
        }
        else {
          if (pAVar10->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar10,(type_info *)&RepeatedField<int>::typeinfo,0x10);
          }
          pLVar8 = (LazyMessageExtension *)
                   ArenaImpl::AllocateAlignedAndAddCleanup
                             (&pAVar10->impl_,0x10,
                              arena_destruct_object<google::protobuf::RepeatedField<int>>);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)pAVar10;
        }
        (pEVar6->field_0).lazymessage_value = pLVar8;
      }
      RepeatedField<int>::MergeFrom
                ((pEVar6->field_0).repeated_int32_value,
                 (other_extension->field_0).repeated_int32_value);
      return;
    case 2:
      if ((local_31 & 1) != 0) {
        pAVar10 = local_40->arena_;
        if (pAVar10 == (Arena *)0x0) {
          pLVar8 = (LazyMessageExtension *)operator_new(0x10);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
        }
        else {
          if (pAVar10->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar10,(type_info *)&RepeatedField<long>::typeinfo,0x10);
          }
          pLVar8 = (LazyMessageExtension *)
                   ArenaImpl::AllocateAlignedAndAddCleanup
                             (&pAVar10->impl_,0x10,
                              arena_destruct_object<google::protobuf::RepeatedField<long>>);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)pAVar10;
        }
        (pEVar6->field_0).lazymessage_value = pLVar8;
      }
      RepeatedField<long>::MergeFrom
                ((pEVar6->field_0).repeated_int64_value,
                 (other_extension->field_0).repeated_int64_value);
      return;
    case 3:
      if ((local_31 & 1) != 0) {
        pAVar10 = local_40->arena_;
        if (pAVar10 == (Arena *)0x0) {
          pLVar8 = (LazyMessageExtension *)operator_new(0x10);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
        }
        else {
          if (pAVar10->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation
                      (pAVar10,(type_info *)&RepeatedField<unsigned_int>::typeinfo,0x10);
          }
          pLVar8 = (LazyMessageExtension *)
                   ArenaImpl::AllocateAlignedAndAddCleanup
                             (&pAVar10->impl_,0x10,
                              arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)pAVar10;
        }
        (pEVar6->field_0).lazymessage_value = pLVar8;
      }
      RepeatedField<unsigned_int>::MergeFrom
                ((pEVar6->field_0).repeated_uint32_value,
                 (other_extension->field_0).repeated_uint32_value);
      return;
    case 4:
      if ((local_31 & 1) != 0) {
        pAVar10 = local_40->arena_;
        if (pAVar10 == (Arena *)0x0) {
          pLVar8 = (LazyMessageExtension *)operator_new(0x10);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
        }
        else {
          if (pAVar10->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation
                      (pAVar10,(type_info *)&RepeatedField<unsigned_long>::typeinfo,0x10);
          }
          pLVar8 = (LazyMessageExtension *)
                   ArenaImpl::AllocateAlignedAndAddCleanup
                             (&pAVar10->impl_,0x10,
                              arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>)
          ;
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)pAVar10;
        }
        (pEVar6->field_0).lazymessage_value = pLVar8;
      }
      RepeatedField<unsigned_long>::MergeFrom
                ((pEVar6->field_0).repeated_uint64_value,
                 (other_extension->field_0).repeated_uint64_value);
      return;
    case 5:
      if ((local_31 & 1) != 0) {
        pAVar10 = local_40->arena_;
        if (pAVar10 == (Arena *)0x0) {
          pLVar8 = (LazyMessageExtension *)operator_new(0x10);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
        }
        else {
          if (pAVar10->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar10,(type_info *)&RepeatedField<double>::typeinfo,0x10);
          }
          pLVar8 = (LazyMessageExtension *)
                   ArenaImpl::AllocateAlignedAndAddCleanup
                             (&pAVar10->impl_,0x10,
                              arena_destruct_object<google::protobuf::RepeatedField<double>>);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)pAVar10;
        }
        (pEVar6->field_0).lazymessage_value = pLVar8;
      }
      RepeatedField<double>::MergeFrom
                ((pEVar6->field_0).repeated_double_value,
                 (other_extension->field_0).repeated_double_value);
      return;
    case 6:
      if ((local_31 & 1) != 0) {
        pAVar10 = local_40->arena_;
        if (pAVar10 == (Arena *)0x0) {
          pLVar8 = (LazyMessageExtension *)operator_new(0x10);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
        }
        else {
          if (pAVar10->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar10,(type_info *)&RepeatedField<float>::typeinfo,0x10);
          }
          pLVar8 = (LazyMessageExtension *)
                   ArenaImpl::AllocateAlignedAndAddCleanup
                             (&pAVar10->impl_,0x10,
                              arena_destruct_object<google::protobuf::RepeatedField<float>>);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)pAVar10;
        }
        (pEVar6->field_0).lazymessage_value = pLVar8;
      }
      RepeatedField<float>::MergeFrom
                ((pEVar6->field_0).repeated_float_value,
                 (other_extension->field_0).repeated_float_value);
      return;
    case 7:
      if ((local_31 & 1) != 0) {
        pAVar10 = local_40->arena_;
        if (pAVar10 == (Arena *)0x0) {
          pLVar8 = (LazyMessageExtension *)operator_new(0x10);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
        }
        else {
          if (pAVar10->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar10,(type_info *)&RepeatedField<bool>::typeinfo,0x10);
          }
          pLVar8 = (LazyMessageExtension *)
                   ArenaImpl::AllocateAlignedAndAddCleanup
                             (&pAVar10->impl_,0x10,
                              arena_destruct_object<google::protobuf::RepeatedField<bool>>);
          pLVar8->_vptr_LazyMessageExtension = (_func_int **)0x0;
          pLVar8[1]._vptr_LazyMessageExtension = (_func_int **)pAVar10;
        }
        (pEVar6->field_0).lazymessage_value = pLVar8;
      }
      RepeatedField<bool>::MergeFrom
                ((pEVar6->field_0).repeated_bool_value,
                 (other_extension->field_0).repeated_bool_value);
      return;
    case 9:
      if ((local_31 & 1) != 0) {
        pAVar10 = local_40->arena_;
        if (pAVar10 == (Arena *)0x0) {
          pRVar9 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)operator_new(0x18);
          (pRVar9->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
          (pRVar9->super_RepeatedPtrFieldBase).current_size_ = 0;
          (pRVar9->super_RepeatedPtrFieldBase).total_size_ = 0;
          (pRVar9->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
        }
        else {
          if (pAVar10->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation
                      (pAVar10,(type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18);
          }
          pRVar9 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)ArenaImpl::AllocateAlignedAndAddCleanup
                                (&pAVar10->impl_,0x18,
                                 arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                                );
          (pRVar9->super_RepeatedPtrFieldBase).arena_ = pAVar10;
          (pRVar9->super_RepeatedPtrFieldBase).current_size_ = 0;
          (pRVar9->super_RepeatedPtrFieldBase).total_size_ = 0;
          (pRVar9->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
        }
        (pEVar6->field_0).repeated_string_value = pRVar9;
      }
      RepeatedPtrFieldBase::
      MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)(pEVar6->field_0).string_value,
                 (RepeatedPtrFieldBase *)(other_extension->field_0).string_value);
      return;
    case 10:
      goto switchD_00217c0c_caseD_a;
    default:
      return;
    }
  }
  if ((other_extension->field_0xa & 1) != 0) {
    return;
  }
  bVar4 = other_extension->type;
  if ((byte)(bVar4 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
               ,0x3c);
    pLVar7 = LogMessage::operator<<
                       (&local_80,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=((LogFinisher *)&local_148,pLVar7);
    LogMessage::~LogMessage(&local_80);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar4 * 4)) {
  case 1:
    SetInt32(local_40,number,other_extension->type,(other_extension->field_0).int32_value,
             other_extension->descriptor);
    break;
  case 2:
    SetInt64(local_40,number,other_extension->type,(other_extension->field_0).int64_value,
             other_extension->descriptor);
    break;
  case 3:
    SetUInt32(local_40,number,other_extension->type,(other_extension->field_0).uint32_value,
              other_extension->descriptor);
    break;
  case 4:
    SetUInt64(local_40,number,other_extension->type,(other_extension->field_0).uint64_value,
              other_extension->descriptor);
    break;
  case 5:
    SetDouble(local_40,number,other_extension->type,(other_extension->field_0).double_value,
              other_extension->descriptor);
    break;
  case 6:
    SetFloat(local_40,number,other_extension->type,(other_extension->field_0).float_value,
             other_extension->descriptor);
    break;
  case 7:
    SetBool(local_40,number,other_extension->type,(other_extension->field_0).bool_value,
            other_extension->descriptor);
    break;
  case 8:
    SetEnum(local_40,number,other_extension->type,(other_extension->field_0).enum_value,
            other_extension->descriptor);
    break;
  case 9:
    type = other_extension->type;
    pp_Var2 = ((other_extension->field_0).lazymessage_value)->_vptr_LazyMessageExtension;
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,pp_Var2,
               (long)(other_extension->field_0).lazymessage_value[1]._vptr_LazyMessageExtension +
               (long)pp_Var2);
    psVar11 = MutableString_abi_cxx11_(local_40,number,type,other_extension->descriptor);
    std::__cxx11::string::operator=((string *)psVar11,(string *)local_a0);
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0]);
    }
    break;
  case 10:
    pFVar1 = other_extension->descriptor;
    pVar17 = Insert(local_40,number);
    uVar16 = pVar17._8_8_;
    pEVar6 = pVar17.first;
    pEVar6->descriptor = pFVar1;
    if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (pEVar6->type != other_extension->type) {
        LogMessage::LogMessage
                  (&local_148,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                   ,0x40a);
        pLVar7 = LogMessage::operator<<
                           (&local_148,"CHECK failed: (extension->type) == (other_extension.type): "
                           );
        LogFinisher::operator=((LogFinisher *)&local_110,pLVar7);
        LogMessage::~LogMessage(&local_148);
        uVar16 = extraout_RDX;
      }
      if (pEVar6->is_packed != other_extension->is_packed) {
        LogMessage::LogMessage
                  (&local_110,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                   ,0x40b);
        pLVar7 = LogMessage::operator<<
                           (&local_110,
                            "CHECK failed: (extension->is_packed) == (other_extension.is_packed): ")
        ;
        LogFinisher::operator=((LogFinisher *)&local_d8,pLVar7);
        LogMessage::~LogMessage(&local_110);
        uVar16 = extraout_RDX_00;
      }
      if (pEVar6->is_repeated == true) {
        LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                   ,0x40c);
        pLVar7 = LogMessage::operator<<(&local_d8,"CHECK failed: !extension->is_repeated: ");
        LogFinisher::operator=(&local_41,pLVar7);
        LogMessage::~LogMessage(&local_d8);
        uVar16 = extraout_RDX_01;
      }
      pAVar10 = (Arena *)(pEVar6->field_0).repeated_string_value;
      pRVar9 = (other_extension->field_0).repeated_string_value;
      if ((other_extension->field_0xa & 0x10) == 0) {
        pSVar15 = (pAVar10->impl_).threads_._M_b._M_p;
        if ((pEVar6->field_0xa & 0x10) != 0) {
          pAVar10 = (Arena *)(*(code *)pSVar15->next_)(pAVar10);
          goto LAB_00218354;
        }
        (*(code *)pSVar15->cleanup_limit_)();
      }
      else {
        if ((pEVar6->field_0xa & 0x10) == 0) {
          iVar14 = (*(code *)(((pRVar9->super_RepeatedPtrFieldBase).arena_)->impl_).initial_block_)
                             (pRVar9,pAVar10);
          pSVar15 = (pAVar10->impl_).threads_._M_b._M_p;
          goto LAB_0021835d;
        }
        (*(code *)(pAVar10->impl_).threads_._M_b._M_p[1].next_)(pAVar10,pRVar9,uVar16);
      }
    }
    else {
      pEVar6->type = other_extension->type;
      pEVar6->is_packed = other_extension->is_packed;
      pEVar6->is_repeated = false;
      bVar4 = pEVar6->field_0xa & 0xf;
      if ((other_extension->field_0xa & 0x10) == 0) {
        pEVar6->field_0xa = bVar4;
        pAVar10 = (Arena *)(*(code *)(((((other_extension->field_0).repeated_string_value)->
                                       super_RepeatedPtrFieldBase).arena_)->impl_).lifecycle_id_)
                                     ((other_extension->field_0).repeated_string_value,
                                      local_40->arena_);
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)pAVar10;
LAB_00218354:
        iVar14 = (other_extension->field_0).int64_value;
        pSVar15 = (pAVar10->impl_).threads_._M_b._M_p;
LAB_0021835d:
        (*(code *)pSVar15->cleanup_limit_)(pAVar10,iVar14);
      }
      else {
        pEVar6->field_0xa = bVar4 | 0x10;
        auVar18 = (*(code *)(((((other_extension->field_0).repeated_string_value)->
                              super_RepeatedPtrFieldBase).arena_)->impl_).space_allocated_.
                            super___atomic_base<unsigned_long>._M_i)
                            ((other_extension->field_0).repeated_string_value,local_40->arena_);
        pAVar10 = auVar18._0_8_;
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)pAVar10;
        (*(code *)(pAVar10->impl_).threads_._M_b._M_p[1].next_)
                  (pAVar10,(other_extension->field_0).string_value,auVar18._8_8_);
      }
    }
    pEVar6->field_0xa = pEVar6->field_0xa & 0xf0;
  }
  return;
switchD_00217c0c_caseD_a:
  if ((local_31 & 1) != 0) {
    pAVar10 = local_40->arena_;
    if (pAVar10 == (Arena *)0x0) {
      pRVar9 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x18);
      (pRVar9->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (pRVar9->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar9->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar9->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    else {
      if (pAVar10->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation
                  (pAVar10,(type_info *)&RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,
                   0x18);
      }
      pRVar9 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)ArenaImpl::AllocateAlignedAndAddCleanup
                            (&pAVar10->impl_,0x18,
                             arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                            );
      (pRVar9->super_RepeatedPtrFieldBase).arena_ = pAVar10;
      (pRVar9->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar9->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar9->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    (pEVar6->field_0).repeated_string_value = pRVar9;
  }
  psVar11 = (other_extension->field_0).string_value;
  if ((int)psVar11->_M_string_length < 1) {
    return;
  }
  index = 0;
  do {
    pTVar12 = RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                        ((RepeatedPtrFieldBase *)psVar11,index);
    pRVar9 = (pEVar6->field_0).repeated_string_value;
    pRVar3 = (pRVar9->super_RepeatedPtrFieldBase).rep_;
    if (pRVar3 == (Rep *)0x0) {
LAB_002181f9:
      plVar13 = (long *)0x0;
    }
    else {
      iVar5 = (pRVar9->super_RepeatedPtrFieldBase).current_size_;
      if (pRVar3->allocated_size <= iVar5) goto LAB_002181f9;
      (pRVar9->super_RepeatedPtrFieldBase).current_size_ = iVar5 + 1;
      plVar13 = (long *)pRVar3->elements[iVar5];
    }
    if (plVar13 == (long *)0x0) {
      iVar5 = (*pTVar12->_vptr_MessageLite[4])(pTVar12,local_40->arena_);
      plVar13 = (long *)CONCAT44(extraout_var,iVar5);
      RepeatedPtrFieldBase::
      AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                ((RepeatedPtrFieldBase *)(pEVar6->field_0).int64_value,plVar13);
    }
    (**(code **)(*plVar13 + 0x40))(plVar13,pTVar12);
    index = index + 1;
    if ((int)psVar11->_M_string_length <= index) {
      return;
    }
  } while( true );
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(
    int number, const Extension& other_extension) {
  if (other_extension.is_repeated) {
    Extension* extension;
    bool is_new =
        MaybeNewExtension(number, other_extension.descriptor, &extension);
    if (is_new) {
      // Extension did not already exist in set.
      extension->type = other_extension.type;
      extension->is_packed = other_extension.is_packed;
      extension->is_repeated = true;
    } else {
      GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
      GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
      GOOGLE_DCHECK(extension->is_repeated);
    }

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE) \
  case WireFormatLite::CPPTYPE_##UPPERCASE:              \
    if (is_new) {                                        \
      extension->repeated_##LOWERCASE##_value =          \
          Arena::CreateMessage<REPEATED_TYPE>(arena_);   \
    }                                                    \
    extension->repeated_##LOWERCASE##_value->MergeFrom(  \
        *other_extension.repeated_##LOWERCASE##_value);  \
    break;

      HANDLE_TYPE(INT32, int32, RepeatedField<int32>);
      HANDLE_TYPE(INT64, int64, RepeatedField<int64>);
      HANDLE_TYPE(UINT32, uint32, RepeatedField<uint32>);
      HANDLE_TYPE(UINT64, uint64, RepeatedField<uint64>);
      HANDLE_TYPE(FLOAT, float, RepeatedField<float>);
      HANDLE_TYPE(DOUBLE, double, RepeatedField<double>);
      HANDLE_TYPE(BOOL, bool, RepeatedField<bool>);
      HANDLE_TYPE(ENUM, enum, RepeatedField<int>);
      HANDLE_TYPE(STRING, string, RepeatedPtrField<std::string>);
#undef HANDLE_TYPE

      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_new) {
          extension->repeated_message_value =
              Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
        }
        // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
        // it would attempt to allocate new objects.
        RepeatedPtrField<MessageLite>* other_repeated_message =
            other_extension.repeated_message_value;
        for (int i = 0; i < other_repeated_message->size(); i++) {
          const MessageLite& other_message = other_repeated_message->Get(i);
          MessageLite* target =
              reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                  extension->repeated_message_value)
                  ->AddFromCleared<GenericTypeHandler<MessageLite>>();
          if (target == NULL) {
            target = other_message.New(arena_);
            extension->repeated_message_value->AddAllocated(target);
          }
          target->CheckTypeAndMergeFrom(other_message);
        }
        break;
    }
  } else {
    if (!other_extension.is_cleared) {
      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)  \
  case WireFormatLite::CPPTYPE_##UPPERCASE:           \
    Set##CAMELCASE(number, other_extension.type,      \
                   other_extension.LOWERCASE##_value, \
                   other_extension.descriptor);       \
    break;

        HANDLE_TYPE(INT32, int32, Int32);
        HANDLE_TYPE(INT64, int64, Int64);
        HANDLE_TYPE(UINT32, uint32, UInt32);
        HANDLE_TYPE(UINT64, uint64, UInt64);
        HANDLE_TYPE(FLOAT, float, Float);
        HANDLE_TYPE(DOUBLE, double, Double);
        HANDLE_TYPE(BOOL, bool, Bool);
        HANDLE_TYPE(ENUM, enum, Enum);
#undef HANDLE_TYPE
        case WireFormatLite::CPPTYPE_STRING:
          SetString(number, other_extension.type, *other_extension.string_value,
                    other_extension.descriptor);
          break;
        case WireFormatLite::CPPTYPE_MESSAGE: {
          Extension* extension;
          bool is_new =
              MaybeNewExtension(number, other_extension.descriptor, &extension);
          if (is_new) {
            extension->type = other_extension.type;
            extension->is_packed = other_extension.is_packed;
            extension->is_repeated = false;
            if (other_extension.is_lazy) {
              extension->is_lazy = true;
              extension->lazymessage_value =
                  other_extension.lazymessage_value->New(arena_);
              extension->lazymessage_value->MergeFrom(
                  *other_extension.lazymessage_value);
            } else {
              extension->is_lazy = false;
              extension->message_value =
                  other_extension.message_value->New(arena_);
              extension->message_value->CheckTypeAndMergeFrom(
                  *other_extension.message_value);
            }
          } else {
            GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
            GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
            GOOGLE_DCHECK(!extension->is_repeated);
            if (other_extension.is_lazy) {
              if (extension->is_lazy) {
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    other_extension.lazymessage_value->GetMessage(
                        *extension->message_value));
              }
            } else {
              if (extension->is_lazy) {
                extension->lazymessage_value
                    ->MutableMessage(*other_extension.message_value)
                    ->CheckTypeAndMergeFrom(*other_extension.message_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            }
          }
          extension->is_cleared = false;
          break;
        }
      }
    }
  }
}